

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stitching.cpp
# Opt level: O3

int print_stitched_file(map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                        *a_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *a_lines_map,
                       map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                       *b_nodes_map,
                       map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                       *b_lines_map,string *outfile_path,string *char_len_over)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Self __tmp_2;
  _Rb_tree_header *p_Var5;
  _Self __tmp;
  ofstream geo_file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::
  _Rb_tree<int,std::pair<int_const,node>,std::_Select1st<std::pair<int_const,node>>,std::less<int>,std::allocator<std::pair<int_const,node>>>
  ::_M_insert_range_unique<std::_Rb_tree_iterator<std::pair<int_const,node>>>
            ((_Rb_tree<int,std::pair<int_const,node>,std::_Select1st<std::pair<int_const,node>>,std::less<int>,std::allocator<std::pair<int_const,node>>>
              *)a_nodes_map,(b_nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_int,_node>_>)
             &(b_nodes_map->_M_t)._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<int,std::pair<int_const,stitch::line>,std::_Select1st<std::pair<int_const,stitch::line>>,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>
  ::_M_insert_range_unique<std::_Rb_tree_iterator<std::pair<int_const,stitch::line>>>
            ((_Rb_tree<int,std::pair<int_const,stitch::line>,std::_Select1st<std::pair<int_const,stitch::line>>,std::less<int>,std::allocator<std::pair<int_const,stitch::line>>>
              *)a_lines_map,(b_lines_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_int,_stitch::line>_>)
             &(b_lines_map->_M_t)._M_impl.super__Rb_tree_header);
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)outfile_path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to create new meshfile.",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    iVar2 = 1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "//========================== Border Nodes ==========================\n",0x45);
    p_Var4 = (a_nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar2 = std::__cxx11::string::compare((char *)char_len_over);
    p_Var5 = &(a_nodes_map->_M_t)._M_impl.super__Rb_tree_header;
    if (iVar2 == 0) {
      if ((_Rb_tree_header *)p_Var4 != p_Var5) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Point(",6);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var4[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = {",5);
          poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_right);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = std::ostream::_M_insert<double>(*(double *)(p_Var4 + 2));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n",3);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var5);
      }
    }
    else if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Point(",6);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var4[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = {",5);
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_right);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char_len_over->_M_dataplus)._M_p,char_len_over->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n",3);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "//========================== Shape Faces ===========================\n",0x45);
    p_Var4 = (a_lines_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(a_lines_map->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Line(",5);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&local_230,p_Var4[1]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = {",5);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)&p_Var4[1].field_0x4)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,*(int *)&p_Var4[1]._M_parent)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n",3);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "//============================== END ================================\n",0x46);
    iVar2 = 0;
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar2;
}

Assistant:

int print_stitched_file(map<int, node> &a_nodes_map,
                        map<int, stitch::line> &a_lines_map,
                        map<int, node> &b_nodes_map,
                        map<int, stitch::line> &b_lines_map,
                        const string &outfile_path,
                        const string &char_len_over) {
  a_nodes_map.insert(b_nodes_map.begin(), b_nodes_map.end());
  a_lines_map.insert(b_lines_map.begin(), b_lines_map.end());
  ofstream geo_file;
  geo_file.open(outfile_path);
  if (geo_file.is_open()) {
    geo_file << "//========================== Border Nodes ==========================\n";
    auto i = a_nodes_map.begin();
    if (char_len_over == "") {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << i->second.characteristic_length << "};\n";
        i++;
      }
    } else {
      while (i != a_nodes_map.end()) {
        geo_file << "Point(" << i->first << ") = {" << i->second.x << ", "
                 << i->second.y << ", " << i->second.z << ", "
                 << char_len_over << "};\n";
        i++;
      }
    }
    geo_file << "//========================== Shape Faces ===========================\n";
    auto j = a_lines_map.begin();
    while (j != a_lines_map.end()) {
      geo_file << "Line(" << j->first << ") = {" << j->second.first << ", "
               << j->second.second << "};\n";
      j++;
    }
    geo_file << "//============================== END ================================\n";
    geo_file.close();
    return 0;
  } else {
    cout << "Unable to create new meshfile." << endl;
    return 1;
  }
}